

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O0

size_t Lib::StringUtils::distance(string *s1,string *s2)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  unsigned_long *puVar6;
  unsigned_long uVar7;
  reference pcVar8;
  size_t t;
  size_t upper;
  const_iterator it2;
  size_t j;
  size_t corner;
  const_iterator it1;
  size_t i;
  size_t k;
  DArray<unsigned_long> costs;
  size_t n;
  size_t m;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffee8;
  DArray<unsigned_long> *in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  DArray<unsigned_long> *in_stack_ffffffffffffff00;
  ulong local_e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  size_t local_80;
  ulong local_78;
  undefined8 local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  ulong local_60;
  size_t local_48;
  DArray<unsigned_long> local_40;
  unsigned_long local_28;
  unsigned_long local_20;
  unsigned_long local_8;
  
  local_20 = std::__cxx11::string::size();
  local_28 = std::__cxx11::string::size();
  local_8 = local_28;
  if (local_20 != 0) {
    if (local_28 == 0) {
      local_8 = local_20;
    }
    else {
      DArray<unsigned_long>::DArray(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      for (local_48 = 0; sVar4 = local_48, local_48 <= local_28; local_48 = local_48 + 1) {
        puVar6 = DArray<unsigned_long>::operator[](&local_40,local_48);
        *puVar6 = sVar4;
      }
      local_60 = 0;
      local_68._M_current = (char *)std::__cxx11::string::begin();
      while( true ) {
        local_70 = std::__cxx11::string::end();
        bVar5 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        if (!bVar5) break;
        uVar7 = local_60 + 1;
        puVar6 = DArray<unsigned_long>::operator[](&local_40,0);
        *puVar6 = uVar7;
        local_78 = local_60;
        local_80 = 0;
        local_88._M_current = (char *)std::__cxx11::string::begin();
        while( true ) {
          std::__cxx11::string::end();
          bVar5 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          if (!bVar5) break;
          puVar6 = DArray<unsigned_long>::operator[](&local_40,local_80 + 1);
          uVar2 = *puVar6;
          pcVar8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_68);
          cVar1 = *pcVar8;
          pcVar8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_88);
          uVar3 = local_78;
          if (cVar1 == *pcVar8) {
            puVar6 = DArray<unsigned_long>::operator[](&local_40,local_80 + 1);
            *puVar6 = uVar3;
          }
          else {
            local_e8 = uVar2;
            if (local_78 <= uVar2) {
              local_e8 = local_78;
            }
            puVar6 = DArray<unsigned_long>::operator[](&local_40,local_80);
            if (*puVar6 < local_e8) {
              puVar6 = DArray<unsigned_long>::operator[](&local_40,local_80);
              local_e8 = *puVar6;
            }
            in_stack_fffffffffffffef0 = (DArray<unsigned_long> *)(local_e8 + 1);
            puVar6 = DArray<unsigned_long>::operator[](&local_40,local_80 + 1);
            *puVar6 = (unsigned_long)in_stack_fffffffffffffef0;
          }
          local_78 = uVar2;
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_88);
          local_80 = local_80 + 1;
        }
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_68);
        local_60 = local_60 + 1;
      }
      puVar6 = DArray<unsigned_long>::operator[](&local_40,local_28);
      local_8 = *puVar6;
      DArray<unsigned_long>::~DArray(in_stack_fffffffffffffef0);
    }
  }
  return local_8;
}

Assistant:

size_t StringUtils::distance(const std::string &s1, const std::string &s2)
{
  const size_t m(s1.size());
  const size_t n(s2.size());

  if( m==0 ) return n;
  if( n==0 ) return m;

  DArray<size_t> costs = DArray<size_t>(n+1);

  for( size_t k=0; k<=n; k++ ) costs[k] = k;

  size_t i = 0;
  for ( std::string::const_iterator it1 = s1.begin(); it1 != s1.end(); ++it1, ++i )
  {
    costs[0] = i+1;
    size_t corner = i;

    size_t j = 0;
    for ( std::string::const_iterator it2 = s2.begin(); it2 != s2.end(); ++it2, ++j )
    {
      size_t upper = costs[j+1];
      if( *it1 == *it2 ){costs[j+1] = corner;}
      else{
        size_t t(upper<corner?upper:corner);
        costs[j+1] = (costs[j]<t?costs[j]:t)+1;
      }
      corner = upper;
    }
  }

  return costs[n];
}